

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
 testing::internal::
 ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
           (const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
            begin,const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                  end,int *elem)

{
  bool bVar1;
  const_reference piVar2;
  ulong uVar3;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *psVar4;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *psVar5;
  ulong uVar6;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *psVar7;
  ulong uVar8;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  cVar9;
  
  uVar3 = end.pos;
  psVar4 = end.table;
  uVar6 = begin.pos;
  psVar7 = begin.table;
  psVar5 = psVar4;
  if (uVar6 != uVar3 || ((ulong)psVar7 ^ (ulong)psVar4) != 0) {
    uVar8 = uVar6;
    do {
      piVar2 = google::
               sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::get
                         ((psVar7->groups).
                          super__Vector_base<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>,_google::libc_allocator_with_realloc<google::sparsegroup<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar8 / 0x30,
                          (short)uVar8 + (short)(uVar8 / 0x30) * -0x30);
      psVar5 = psVar7;
      uVar6 = uVar8;
      if (*piVar2 == *elem) break;
      bVar1 = uVar3 - 1 != uVar8;
      psVar5 = psVar4;
      uVar6 = uVar3;
      uVar8 = uVar8 + 1;
    } while (bVar1 || ((ulong)psVar7 ^ (ulong)psVar4) != 0);
  }
  cVar9.pos = uVar6;
  cVar9.table = psVar5;
  return cVar9;
}

Assistant:

Iter ArrayAwareFind(Iter begin, Iter end, const Element& elem) {
  for (Iter it = begin; it != end; ++it) {
    if (internal::ArrayEq(*it, elem)) return it;
  }
  return end;
}